

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv4Transmitter::ProcessAddAcceptIgnoreEntry
          (RTPUDPv4Transmitter *this,uint32_t ip,uint16_t port)

{
  size_t *psVar1;
  list<unsigned_short,_std::allocator<unsigned_short>_> *plVar2;
  RTPMemoryManager *pRVar3;
  _List_node_base *p_Var4;
  HashElement *pHVar5;
  PortInfo *pPVar6;
  _List_node_base *p_Var7;
  HashElement *pHVar8;
  _Self __tmp;
  uint uVar9;
  
  uVar9 = ip % 0x207d;
  pHVar8 = (this->acceptignoreinfo).table[uVar9];
  (this->acceptignoreinfo).curhashelem = pHVar8;
  while( true ) {
    if (pHVar8 == (HashElement *)0x0) {
      pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar3 == (RTPMemoryManager *)0x0) {
        pPVar6 = (PortInfo *)operator_new(0x20);
      }
      else {
        pPVar6 = (PortInfo *)(**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,0x20,0xc);
      }
      plVar2 = &pPVar6->portlist;
      (pPVar6->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
      (pPVar6->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      _M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
      (pPVar6->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      _M_node._M_size = 0;
      pPVar6->all = false;
      if (port == 0) {
        pPVar6->all = true;
      }
      else {
        p_Var7 = (_List_node_base *)operator_new(0x18);
        *(uint16_t *)&p_Var7[1]._M_next = port;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        psVar1 = &(pPVar6->portlist).
                  super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node.
                  _M_size;
        *psVar1 = *psVar1 + 1;
      }
      pHVar8 = (this->acceptignoreinfo).table[uVar9];
      while( true ) {
        if (pHVar8 == (HashElement *)0x0) {
          pRVar3 = (this->acceptignoreinfo).super_RTPMemoryObject.mgr;
          if (pRVar3 == (RTPMemoryManager *)0x0) {
            pHVar8 = (HashElement *)operator_new(0x30);
          }
          else {
            pHVar8 = (HashElement *)
                     (**(code **)(*(long *)pRVar3 + 0x10))
                               (pRVar3,0x30,(this->acceptignoreinfo).memorytype);
          }
          pHVar8->key = ip;
          pHVar8->element = pPVar6;
          pHVar8->hashprev = (HashElement *)0x0;
          pHVar8->hashnext = (HashElement *)0x0;
          pHVar8->listprev = (HashElement *)0x0;
          pHVar8->listnext = (HashElement *)0x0;
          pHVar8->hashindex = uVar9;
          pHVar5 = (this->acceptignoreinfo).table[uVar9];
          (this->acceptignoreinfo).table[uVar9] = pHVar8;
          pHVar8->hashnext = pHVar5;
          if (pHVar5 != (HashElement *)0x0) {
            pHVar5->hashprev = pHVar8;
          }
          if ((this->acceptignoreinfo).firsthashelem == (HashElement *)0x0) {
            (this->acceptignoreinfo).firsthashelem = pHVar8;
          }
          else {
            pHVar5 = (this->acceptignoreinfo).lasthashelem;
            pHVar5->listnext = pHVar8;
            pHVar8->listprev = pHVar5;
          }
          (this->acceptignoreinfo).lasthashelem = pHVar8;
          return 0;
        }
        if (pHVar8->key == ip) break;
        pHVar8 = pHVar8->hashnext;
      }
      pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      p_Var7 = (plVar2->super__List_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               _M_node.super__List_node_base._M_next;
      if (pRVar3 == (RTPMemoryManager *)0x0) {
        while (p_Var7 != (_List_node_base *)plVar2) {
          p_Var4 = p_Var7->_M_next;
          operator_delete(p_Var7,0x18);
          p_Var7 = p_Var4;
        }
        operator_delete(pPVar6,0x20);
      }
      else {
        while (p_Var7 != (_List_node_base *)plVar2) {
          p_Var4 = p_Var7->_M_next;
          operator_delete(p_Var7,0x18);
          p_Var7 = p_Var4;
        }
        (**(code **)(*(long *)pRVar3 + 0x18))(pRVar3,pPVar6);
      }
      return -9;
    }
    if (pHVar8->key == ip) break;
    pHVar8 = pHVar8->hashnext;
    (this->acceptignoreinfo).curhashelem = pHVar8;
  }
  pPVar6 = pHVar8->element;
  if (port == 0) {
    pPVar6->all = true;
    std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear(&pPVar6->portlist);
    return 0;
  }
  if (pPVar6->all != false) {
    return 0;
  }
  p_Var7 = (pPVar6->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    if (p_Var7 == (_List_node_base *)&pPVar6->portlist) {
      p_Var7 = (_List_node_base *)operator_new(0x18);
      *(uint16_t *)&p_Var7[1]._M_next = port;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      psVar1 = &(pPVar6->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      return 0;
    }
    if (*(uint16_t *)&p_Var7[1]._M_next == port) break;
    p_Var7 = p_Var7->_M_next;
  }
  return 0;
}

Assistant:

int RTPUDPv4Transmitter::ProcessAddAcceptIgnoreEntry(uint32_t ip,uint16_t port)
{
	acceptignoreinfo.GotoElement(ip);
	if (acceptignoreinfo.HasCurrentElement()) // An entry for this IP address already exists
	{
		PortInfo *portinf = acceptignoreinfo.GetCurrentElement();
		
		if (port == 0) // select all ports
		{
			portinf->all = true;
			portinf->portlist.clear();
		}
		else if (!portinf->all)
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = portinf->portlist.begin();
			end = portinf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == port) // already in list
					return 0;
			}
			portinf->portlist.push_front(port);
		}
	}
	else // got to create an entry for this IP address
	{
		PortInfo *portinf;
		int status;
		
		portinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_ACCEPTIGNOREPORTINFO) PortInfo();
		if (port == 0) // select all ports
			portinf->all = true;
		else
			portinf->portlist.push_front(port);
		
		status = acceptignoreinfo.AddElement(ip,portinf);
		if (status < 0)
		{
			RTPDelete(portinf,GetMemoryManager());
			return status;
		}
	}

	return 0;
}